

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileWatcherGeneric.cpp
# Opt level: O3

void __thiscall efsw::FileWatcherGeneric::~FileWatcherGeneric(FileWatcherGeneric *this)

{
  pointer ppWVar1;
  pointer ppWVar2;
  
  (this->super_FileWatcherImpl)._vptr_FileWatcherImpl =
       (_func_int **)&PTR__FileWatcherGeneric_0011eac0;
  (this->super_FileWatcherImpl).mInitOK.set_._M_base._M_i = false;
  if (this->mThread != (Thread *)0x0) {
    (*this->mThread->_vptr_Thread[1])();
    this->mThread = (Thread *)0x0;
  }
  ppWVar1 = (this->mWatches).
            super__Vector_base<efsw::WatcherGeneric_*,_std::allocator<efsw::WatcherGeneric_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  for (ppWVar2 = (this->mWatches).
                 super__Vector_base<efsw::WatcherGeneric_*,_std::allocator<efsw::WatcherGeneric_*>_>
                 ._M_impl.super__Vector_impl_data._M_start; ppWVar2 != ppWVar1;
      ppWVar2 = ppWVar2 + 1) {
    if (*ppWVar2 != (WatcherGeneric *)0x0) {
      (*((*ppWVar2)->super_Watcher)._vptr_Watcher[1])();
      *ppWVar2 = (WatcherGeneric *)0x0;
      ppWVar1 = (this->mWatches).
                super__Vector_base<efsw::WatcherGeneric_*,_std::allocator<efsw::WatcherGeneric_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
    }
  }
  Mutex::~Mutex(&this->mWatchesLock);
  ppWVar2 = (this->mWatches).
            super__Vector_base<efsw::WatcherGeneric_*,_std::allocator<efsw::WatcherGeneric_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if (ppWVar2 != (pointer)0x0) {
    operator_delete(ppWVar2);
  }
  FileWatcherImpl::~FileWatcherImpl(&this->super_FileWatcherImpl);
  return;
}

Assistant:

FileWatcherGeneric::~FileWatcherGeneric() {
	mInitOK = false;

	efSAFE_DELETE( mThread );

	/// Delete the watches
	WatchList::iterator it = mWatches.begin();

	for ( ; it != mWatches.end(); ++it ) {
		efSAFE_DELETE( ( *it ) );
	}
}